

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

bool am_delete_commands_ok_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  undefined1 local_48 [8];
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object script_window;
  Am_Object *self_local;
  
  script_window.data = (Am_Object_Data *)self;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&sel_list.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar2);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_48);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_18);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, am_delete_commands_ok)
{
  Am_Object script_window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  return sel_list.Valid();
}